

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O0

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkBinary
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeBin *pnode,Context context)

{
  bool bVar1;
  ResultType local_21;
  ResultType result;
  Context context_local;
  ParseNodeBin *pnode_local;
  ParseNodeWalker<WalkerPolicyTest> *this_local;
  
  local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkFirstChild
                       ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                        pnode->pnode1,context);
  bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                    (&this->super_WalkerPolicyTest,local_21);
  if (bVar1) {
    local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNode
                         ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                          &pnode->super_ParseNode,context);
    bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                      (&this->super_WalkerPolicyTest,local_21);
    if (bVar1) {
      local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkSecondChild
                           ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                            pnode->pnode2,context);
    }
  }
  return local_21;
}

Assistant:

ResultType WalkBinary(ParseNodeBin *pnode, Context context)
    {
        ResultType result = WalkFirstChild(pnode->pnode1, context);
        if (ContinueWalk(result))
        {
            result = WalkNode(pnode, context);
            if (ContinueWalk(result)) result = WalkSecondChild(pnode->pnode2, context);
        }
        return result;
    }